

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O1

void pbrt::RGBColorSpace::Init(Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_48;
  string local_40;
  SpectrumHandle local_20;
  RGBColorSpace *pRVar3;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"stdillum-D65","");
  GetNamedSpectrum((pbrt *)&local_48,&local_40);
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x98,8);
  pRVar3 = (RGBColorSpace *)CONCAT44(extraout_var,iVar2);
  local_20.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )local_48.bits;
  RGBColorSpace(pRVar3,(Point2f)0x3ea8f5c33f23d70a,(Point2f)0x3f19999a3e99999a,
                (Point2f)0x3d75c28f3e19999a,&local_20,RGBToSpectrumTable::sRGB,alloc);
  sRGB = pRVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"stdillum-D65","");
  GetNamedSpectrum((pbrt *)&local_48,&local_40);
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x98,8);
  pRVar3 = (RGBColorSpace *)CONCAT44(extraout_var_00,iVar2);
  local_20.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )local_48.bits;
  RGBColorSpace(pRVar3,(Point2f)0x3ea3d70a3f2e147b,(Point2f)0x3f30a3d73e87ae14,
                (Point2f)0x3d75c28f3e19999a,&local_20,RGBToSpectrumTable::DCI_P3,alloc);
  DCI_P3 = pRVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"stdillum-D65","");
  GetNamedSpectrum((pbrt *)&local_48,&local_40);
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x98,8);
  pRVar3 = (RGBColorSpace *)CONCAT44(extraout_var_01,iVar2);
  local_20.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )local_48.bits;
  RGBColorSpace(pRVar3,(Point2f)0x3e9581063f353f7d,(Point2f)0x3f4c08313e2e147b,
                (Point2f)0x3d3c6a7f3e0624dd,&local_20,RGBToSpectrumTable::Rec2020,alloc);
  Rec2020 = pRVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"illum-acesD60","");
  GetNamedSpectrum((pbrt *)&local_48,&local_40);
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x98,8);
  pRVar3 = (RGBColorSpace *)CONCAT44(extraout_var_02,iVar2);
  local_20.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )local_48.bits;
  RGBColorSpace(pRVar3,(Point2f)0x3e87d5673f3c154d,(Point2f)0x3f80000000000000,
                (Point2f)0xbd9db22d38d1b717,&local_20,RGBToSpectrumTable::ACES2065_1,alloc);
  ACES2065_1 = pRVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RGBColorSpace::Init(Allocator alloc) {
    // Rec. ITU-R BT.709.3
    sRGB = alloc.new_object<RGBColorSpace>(
        Point2f(.64, .33), Point2f(.3, .6), Point2f(.15, .06),
        GetNamedSpectrum("stdillum-D65"), RGBToSpectrumTable::sRGB, alloc);
    // P3-D65 (display)
    DCI_P3 = alloc.new_object<RGBColorSpace>(
        Point2f(.68, .32), Point2f(.265, .690), Point2f(.15, .06),
        GetNamedSpectrum("stdillum-D65"), RGBToSpectrumTable::DCI_P3, alloc);
    // ITU-R Rec BT.2020
    Rec2020 = alloc.new_object<RGBColorSpace>(
        Point2f(.708, .292), Point2f(.170, .797), Point2f(.131, .046),
        GetNamedSpectrum("stdillum-D65"), RGBToSpectrumTable::Rec2020, alloc);
    ACES2065_1 = alloc.new_object<RGBColorSpace>(
        Point2f(.7347, .2653), Point2f(0., 1.), Point2f(.0001, -.077),
        GetNamedSpectrum("illum-acesD60"), RGBToSpectrumTable::ACES2065_1, alloc);
#ifdef PBRT_BUILD_GPU_RENDERER
    if (Options->useGPU) {
        CUDA_CHECK(cudaMemcpyToSymbol(RGBColorSpace_sRGB, &RGBColorSpace::sRGB,
                                      sizeof(RGBColorSpace_sRGB)));
        CUDA_CHECK(cudaMemcpyToSymbol(RGBColorSpace_DCI_P3, &RGBColorSpace::DCI_P3,
                                      sizeof(RGBColorSpace_DCI_P3)));
        CUDA_CHECK(cudaMemcpyToSymbol(RGBColorSpace_Rec2020, &RGBColorSpace::Rec2020,
                                      sizeof(RGBColorSpace_Rec2020)));
        CUDA_CHECK(cudaMemcpyToSymbol(RGBColorSpace_ACES2065_1,
                                      &RGBColorSpace::ACES2065_1,
                                      sizeof(RGBColorSpace_ACES2065_1)));
    }
#endif
}